

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont.cpp
# Opt level: O2

bool __thiscall
QRawFont::glyphIndexesForChars
          (QRawFont *this,QChar *chars,int numChars,quint32 *glyphIndexes,int *numGlyphs)

{
  long lVar1;
  QFontEngine *pQVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = ((this->d).d.ptr)->fontEngine;
  if (numChars < 1 || pQVar2 == (QFontEngine *)0x0) {
    *numGlyphs = 0;
  }
  else {
    if (glyphIndexes != (quint32 *)0x0 && 0 < *numGlyphs) {
      iVar3 = (*pQVar2->_vptr_QFontEngine[0xc])();
      bVar4 = -1 < iVar3;
      goto LAB_004455db;
    }
    *numGlyphs = numChars;
  }
  bVar4 = false;
LAB_004455db:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QRawFont::glyphIndexesForChars(const QChar *chars, int numChars, quint32 *glyphIndexes, int *numGlyphs) const
{
    Q_ASSERT(numGlyphs);
    if (!d->isValid() || numChars <= 0) {
        *numGlyphs = 0;
        return false;
    }

    if (*numGlyphs <= 0 || !glyphIndexes) {
        *numGlyphs = numChars;
        return false;
    }

    QGlyphLayout glyphs;
    glyphs.numGlyphs = *numGlyphs;
    glyphs.glyphs = glyphIndexes;
    return d->fontEngine->stringToCMap(chars, numChars, &glyphs, numGlyphs, QFontEngine::GlyphIndicesOnly) >= 0;
}